

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void cs_impl::check_args<cs::numeric,cs::numeric>(vector *args)

{
  size_type sVar1;
  string *str;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDI;
  sequence<0,_1> *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  undefined1 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  
  sVar1 = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RDI);
  if (sVar1 == 2) {
    check_args_base<cs::numeric,cs::numeric,0,1>
              ((vector *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38);
    return;
  }
  uVar2 = 1;
  str = (string *)__cxa_allocate_exception(0x28);
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff78);
  std::operator+((char *)in_stack_ffffffffffffff48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar2,in_stack_ffffffffffffff40));
  std::operator+(in_stack_ffffffffffffff48,(char *)CONCAT17(uVar2,in_stack_ffffffffffffff40));
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RDI);
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff78);
  std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  cs::runtime_error::runtime_error((runtime_error *)CONCAT17(uVar2,in_stack_ffffffffffffff40),str);
  __cxa_throw(str,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

void check_args(const cs::vector &args)
	{
		if (sizeof...(ArgTypes) == args.size())
			check_args_base<ArgTypes...>(args, cov::make_sequence<sizeof...(ArgTypes)>::result);
		else
			throw cs::runtime_error(
			    "Wrong size of the arguments. Expected " + std::to_string(sizeof...(ArgTypes)) + ", provided " +
			    std::to_string(args.size()));
	}